

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassFieldFromObject
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  FieldDescriptor *pFVar1;
  Printer *this_00;
  bool bVar2;
  Type TVar3;
  CppType CVar4;
  GeneratorOptions *options_00;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  FieldDescriptor *field_03;
  FieldDescriptor *field_04;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_70;
  string local_50;
  FieldDescriptor *local_30;
  FieldDescriptor *value_field;
  FieldDescriptor *field_local;
  Printer *printer_local;
  GeneratorOptions *options_local;
  Generator *this_local;
  
  value_field = field;
  field_local = (FieldDescriptor *)printer;
  printer_local = (Printer *)options;
  options_local = (GeneratorOptions *)this;
  bVar2 = anon_unknown_0::IsMap(options,field);
  if (bVar2) {
    local_30 = anon_unknown_0::MapFieldValue(value_field);
    TVar3 = FieldDescriptor::type(local_30);
    pFVar1 = field_local;
    if (TVar3 == TYPE_MESSAGE) {
      (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
                (&local_50,(_anonymous_namespace_ *)printer_local,(GeneratorOptions *)value_field,
                 field);
      (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                (&local_70,(_anonymous_namespace_ *)value_field,field_00);
      this_00 = printer_local;
      options_00 = (GeneratorOptions *)FieldDescriptor::message_type(local_30);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (&local_a0,(_anonymous_namespace_ *)this_00,options_00,(Descriptor *)field);
      io::Printer::Print((Printer *)pFVar1,
                         "  goog.isDef(obj.$name$) && jspb.Message.setWrapperField(\n      msg, $index$, jspb.Map.fromObject(obj.$name$, $fieldclass$, $fieldclass$.fromObject));\n"
                         ,"name",&local_50,"index",&local_70,"fieldclass",&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
    else {
      (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
                (&local_c0,(_anonymous_namespace_ *)printer_local,(GeneratorOptions *)value_field,
                 field);
      (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                (&local_e0,(_anonymous_namespace_ *)value_field,field_01);
      io::Printer::Print((Printer *)pFVar1,
                         "  goog.isDef(obj.$name$) && jspb.Message.setField(msg, $index$, obj.$name$);\n"
                         ,"name",&local_c0,"index",&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_c0);
    }
  }
  else {
    CVar4 = FieldDescriptor::cpp_type(value_field);
    pFVar1 = field_local;
    if (CVar4 == CPPTYPE_MESSAGE) {
      bVar2 = FieldDescriptor::is_repeated(value_field);
      pFVar1 = field_local;
      if (bVar2) {
        (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
                  (&local_100,(_anonymous_namespace_ *)printer_local,(GeneratorOptions *)value_field
                   ,field);
        (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                  (&local_120,(_anonymous_namespace_ *)value_field,field_02);
        (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
                  (&local_140,(_anonymous_namespace_ *)printer_local,(GeneratorOptions *)value_field
                   ,field);
        io::Printer::Print((Printer *)pFVar1,
                           "  goog.isDef(obj.$name$) && jspb.Message.setRepeatedWrapperField(\n      msg, $index$, goog.array.map(obj.$name$, function(i) {\n        return $fieldclass$.fromObject(i);\n      }));\n"
                           ,"name",&local_100,"index",&local_120,"fieldclass",&local_140);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_100);
      }
      else {
        (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
                  (&local_160,(_anonymous_namespace_ *)printer_local,(GeneratorOptions *)value_field
                   ,field);
        (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                  (&local_180,(_anonymous_namespace_ *)value_field,field_03);
        (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
                  (&local_1a0,(_anonymous_namespace_ *)printer_local,(GeneratorOptions *)value_field
                   ,field);
        io::Printer::Print((Printer *)pFVar1,
                           "  goog.isDef(obj.$name$) && jspb.Message.setWrapperField(\n      msg, $index$, $fieldclass$.fromObject(obj.$name$));\n"
                           ,"name",&local_160,"index",&local_180,"fieldclass",&local_1a0);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&local_160);
      }
    }
    else {
      (anonymous_namespace)::JSObjectFieldName_abi_cxx11_
                (&local_1c0,(_anonymous_namespace_ *)printer_local,(GeneratorOptions *)value_field,
                 field);
      (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                (&local_1e0,(_anonymous_namespace_ *)value_field,field_04);
      io::Printer::Print((Printer *)pFVar1,
                         "  goog.isDef(obj.$name$) && jspb.Message.setField(msg, $index$, obj.$name$);\n"
                         ,"name",&local_1c0,"index",&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_1c0);
    }
  }
  return;
}

Assistant:

void Generator::GenerateClassFieldFromObject(
    const GeneratorOptions& options,
    io::Printer* printer,
    const FieldDescriptor* field) const {
  if (IsMap(options, field)) {
    const FieldDescriptor* value_field = MapFieldValue(field);
    if (value_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      // Since the map values are of message type, we have to do some extra work
      // to recursively call fromObject() on them before setting the map field.
      printer->Print(
          "  goog.isDef(obj.$name$) && jspb.Message.setWrapperField(\n"
          "      msg, $index$, jspb.Map.fromObject(obj.$name$, $fieldclass$, "
          "$fieldclass$.fromObject));\n",
          "name", JSObjectFieldName(options, field),
          "index", JSFieldIndex(field),
          "fieldclass", GetMessagePath(options, value_field->message_type()));
    } else {
      // `msg` is a newly-constructed message object that has not yet built any
      // map containers wrapping underlying arrays, so we can simply directly
      // set the array here without fear of a stale wrapper.
      printer->Print(
          "  goog.isDef(obj.$name$) && "
          "jspb.Message.setField(msg, $index$, obj.$name$);\n",
          "name", JSObjectFieldName(options, field),
          "index", JSFieldIndex(field));
    }
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    // Message field (singular or repeated)
    if (field->is_repeated()) {
      {
        printer->Print(
            "  goog.isDef(obj.$name$) && "
            "jspb.Message.setRepeatedWrapperField(\n"
            "      msg, $index$, goog.array.map(obj.$name$, function(i) {\n"
            "        return $fieldclass$.fromObject(i);\n"
            "      }));\n",
            "name", JSObjectFieldName(options, field),
            "index", JSFieldIndex(field),
            "fieldclass", SubmessageTypeRef(options, field));
      }
    } else {
      printer->Print(
          "  goog.isDef(obj.$name$) && jspb.Message.setWrapperField(\n"
          "      msg, $index$, $fieldclass$.fromObject(obj.$name$));\n",
          "name", JSObjectFieldName(options, field),
          "index", JSFieldIndex(field),
          "fieldclass", SubmessageTypeRef(options, field));
    }
  } else {
    // Simple (primitive) field.
    printer->Print(
        "  goog.isDef(obj.$name$) && jspb.Message.setField(msg, $index$, "
        "obj.$name$);\n",
        "name", JSObjectFieldName(options, field),
        "index", JSFieldIndex(field));
  }
}